

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

bool __thiscall blc::network::Socket::readable(Socket *this)

{
  uint __i;
  int iVar1;
  long lVar2;
  ssize_t sVar3;
  char tmp;
  timeval timeout;
  fd_set fds;
  
  timeout.tv_sec = 0;
  timeout.tv_usec = 0;
  if (this->_opened != false) {
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      fds.fds_bits[lVar2] = 0;
    }
    iVar1 = this->_socket;
    fds.fds_bits[iVar1 / 0x40] = fds.fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
    iVar1 = select(iVar1 + 1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&timeout);
    if (iVar1 < 1) {
      return false;
    }
    sVar3 = recv(this->_socket,&tmp,1,0x42);
    if (sVar3 != 0) {
      return true;
    }
    (*(this->super_stream)._vptr_stream[3])(this);
  }
  return false;
}

Assistant:

bool blc::network::Socket::readable() const {
	fd_set		fds;
	struct timeval	timeout = {0, 0};
	char		tmp;

	if (this->_opened == false)
		return (false);
	FD_ZERO(&fds);
	FD_SET(this->_socket, &fds);
	if (select(this->_socket + 1, &fds, 0, 0, &timeout) <= 0)
		return (false);
	if (::recv(this->_socket, &tmp, 1, MSG_PEEK | MSG_DONTWAIT) == 0) {
		const_cast<blc::network::Socket *>(this)->close();
		return (false);
	}
	return (true);
}